

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MruDictionary.h
# Opt level: O2

void __thiscall
JsUtil::
MruDictionary<UnifiedRegex::RegexKey,_UnifiedRegex::RegexPattern_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry>
::ReuseLeastRecentlyUsedEntry
          (MruDictionary<UnifiedRegex::RegexKey,_UnifiedRegex::RegexPattern_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry>
           *this,RegexKey *key,RegexPattern **value,int dictionaryDataIndex)

{
  MruListEntry *entry;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  MruDictionaryData *pMVar4;
  
  if (this->mruListCount != this->mruListCapacity) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/MruDictionary.h"
                       ,0x81,"(mruListCount == mruListCapacity)","mruListCount == mruListCapacity");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  entry = (this->entries).tail.ptr;
  pMVar4 = BaseDictionary<UnifiedRegex::RegexKey,_JsUtil::MruDictionary<UnifiedRegex::RegexKey,_UnifiedRegex::RegexPattern_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry>::MruDictionaryData,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
           ::GetReferenceAt(&this->dictionary,dictionaryDataIndex);
  MruDictionaryData::OnAddedToMruList(pMVar4,entry);
  pMVar4 = BaseDictionary<UnifiedRegex::RegexKey,_JsUtil::MruDictionary<UnifiedRegex::RegexKey,_UnifiedRegex::RegexPattern_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry>::MruDictionaryData,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
           ::GetReferenceAt(&this->dictionary,entry->dictionaryDataIndex);
  MruDictionaryData::OnRemovedFromMruList(pMVar4);
  DoublyLinkedList<JsUtil::MruDictionary<UnifiedRegex::RegexKey,_UnifiedRegex::RegexPattern_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry>::MruListEntry,_Memory::Recycler>
  ::MoveToBeginning(&this->entries,entry);
  UnifiedRegex::RegexKey::operator=(&entry->key,key);
  Memory::WriteBarrierPtr<UnifiedRegex::RegexPattern>::WriteBarrierSet(&entry->value,*value);
  entry->dictionaryDataIndex = dictionaryDataIndex;
  return;
}

Assistant:

void ReuseLeastRecentlyUsedEntry(const TKey &key, const TValue &value, const int dictionaryDataIndex)
        {
            Assert(mruListCount == mruListCapacity);

            // Reuse the least recently used entry for this key/value pair and make it the most recently used
            const auto entry = entries.Tail();
            dictionary.GetReferenceAt(dictionaryDataIndex)->OnAddedToMruList(entry);
            dictionary.GetReferenceAt(entry->dictionaryDataIndex)->OnRemovedFromMruList();
            entries.MoveToBeginning(entry);
            entry->key = key;
            entry->value = value;
            entry->dictionaryDataIndex = dictionaryDataIndex;
        }